

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramStateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::ProgramLogCase::init
          (ProgramLogCase *this,EVP_PKEY_CTX *ctx)

{
  BuildErrorType BVar1;
  bool bVar2;
  ContextType ctxType;
  ApiType requiredApiType;
  int iVar3;
  RenderContext *pRVar4;
  undefined7 extraout_var;
  ContextInfo *pCVar5;
  undefined7 extraout_var_00;
  NotSupportedError *pNVar6;
  bool supportsES32;
  ProgramLogCase *this_local;
  
  pRVar4 = Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar2 = glu::contextSupports(ctxType,requiredApiType);
  BVar1 = this->m_buildErrorType;
  iVar3 = BVar1 - BUILDERROR_GEOMETRY;
  if (BUILDERROR_COMPUTE < BVar1) {
    if (BVar1 == BUILDERROR_GEOMETRY) {
      iVar3 = 0;
      if (!bVar2) {
        pCVar5 = Context::getContextInfo((this->super_TestCase).m_context);
        bVar2 = glu::ContextInfo::isExtensionSupported(pCVar5,"GL_EXT_geometry_shader");
        iVar3 = (int)CONCAT71(extraout_var,bVar2);
        if (!bVar2) {
          pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          tcu::NotSupportedError::NotSupportedError
                    (pNVar6,"Test requires GL_EXT_geometry_shader extension",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
                     ,0x290);
          __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                      tcu::NotSupportedError::~NotSupportedError);
        }
      }
    }
    else {
      iVar3 = BVar1 - BUILDERROR_TESSELLATION;
      if ((iVar3 == 0) && (!bVar2)) {
        pCVar5 = Context::getContextInfo((this->super_TestCase).m_context);
        bVar2 = glu::ContextInfo::isExtensionSupported(pCVar5,"GL_EXT_tessellation_shader");
        iVar3 = (int)CONCAT71(extraout_var_00,bVar2);
        if (!bVar2) {
          pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          tcu::NotSupportedError::NotSupportedError
                    (pNVar6,"Test requires GL_EXT_tessellation_shader extension",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
                     ,0x295);
          __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                      tcu::NotSupportedError::~NotSupportedError);
        }
      }
    }
  }
  return iVar3;
}

Assistant:

void ProgramLogCase::init (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	switch (m_buildErrorType)
	{
		case BUILDERROR_VERTEX_FRAGMENT:
		case BUILDERROR_COMPUTE:
			break;

		case BUILDERROR_GEOMETRY:
			if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader"))
				TCU_THROW(NotSupportedError, "Test requires GL_EXT_geometry_shader extension");
			break;

		case BUILDERROR_TESSELLATION:
			if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader"))
				TCU_THROW(NotSupportedError, "Test requires GL_EXT_tessellation_shader extension");
			break;

		default:
			DE_ASSERT(false);
			break;
	}
}